

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvastexture.cpp
# Opt level: O3

void __thiscall FCanvasTexture::MakeTexture(FCanvasTexture *this)

{
  ushort uVar1;
  ushort uVar2;
  DSimpleCanvas *this_00;
  BYTE *__s;
  ulong uVar3;
  
  this_00 = (DSimpleCanvas *)
            M_Malloc_Dbg(0x50,
                         "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                         ,0x1f7);
  DSimpleCanvas::DSimpleCanvas
            (this_00,(uint)(this->super_FTexture).Width,(uint)(this->super_FTexture).Height);
  this->Canvas = this_00;
  (*(this_00->super_DCanvas).super_DObject._vptr_DObject[8])(this_00);
  GC::AddSoftRoot((DObject *)this->Canvas);
  uVar1 = (this->super_FTexture).Width;
  uVar2 = (this->super_FTexture).Height;
  if (uVar1 == uVar2) {
    if ((this->Canvas->super_DCanvas).Pitch == (uint)uVar1) {
      __s = (this->Canvas->super_DCanvas).Buffer;
      this->Pixels = __s;
      this->bPixelsAllocated = false;
      uVar3 = (ulong)uVar2 * (ulong)(uint)uVar1;
      goto LAB_0065644f;
    }
  }
  uVar3 = (ulong)uVar2 * (ulong)uVar1;
  __s = (BYTE *)operator_new__(uVar3);
  this->Pixels = __s;
  this->bPixelsAllocated = true;
LAB_0065644f:
  memset(__s,0,uVar3 >> 1);
  uVar3 = (ulong)((uint)(this->super_FTexture).Height * (uint)(this->super_FTexture).Width >> 1);
  memset(this->Pixels + uVar3,0xff,uVar3);
  return;
}

Assistant:

void FCanvasTexture::MakeTexture ()
{
	Canvas = new DSimpleCanvas (Width, Height);
	Canvas->Lock ();
	GC::AddSoftRoot(Canvas);
	if (Width != Height || Width != Canvas->GetPitch())
	{
		Pixels = new BYTE[Width*Height];
		bPixelsAllocated = true;
	}
	else
	{
		Pixels = Canvas->GetBuffer();
		bPixelsAllocated = false;
	}
	// Draw a special "unrendered" initial texture into the buffer.
	memset (Pixels, 0, Width*Height/2);
	memset (Pixels+Width*Height/2, 255, Width*Height/2);
}